

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cpp
# Opt level: O1

bool __thiscall LiteScript::State::Finished(State *this)

{
  pointer pvVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = (ulong)this->instr_index;
  pvVar1 = (this->instr).
           super__Vector_base<std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>,_std::allocator<std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar3 = ((long)(this->instr).
                 super__Vector_base<std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>,_std::allocator<std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 3) *
          -0x5555555555555555;
  if (uVar2 <= uVar3 && uVar3 - uVar2 != 0) {
    return false;
  }
  return (ulong)((long)*(pointer *)
                        ((long)&pvVar1[uVar2].
                                super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                                ._M_impl + 8) -
                 *(long *)&pvVar1[uVar2].
                           super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                           ._M_impl >> 4) <= (ulong)this->line_num;
}

Assistant:

bool LiteScript::State::Finished() const {
    return (this->instr_index >= this->instr.size() && this->line_num >= this->instr[this->instr_index].size());
}